

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereUsablePartialIndex(int iTab,WhereClause *pWC,Expr *pWhere)

{
  int iVar1;
  int iVar2;
  WhereClause *in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  Expr *pExpr;
  Parse *pParse;
  WhereTerm *pTerm;
  int i;
  long *plVar3;
  Expr *pE2;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  plVar3 = *(long **)*in_RSI;
  for (; *(char *)&in_RDX->pWInfo == ','; in_RDX = *(WhereClause **)&in_RDX->nSlot) {
    iVar1 = whereUsablePartialIndex
                      ((int)in_RSI,in_RDX,
                       (Expr *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (iVar1 == 0) {
      return 0;
    }
  }
  if ((*(ulong *)(*plVar3 + 0x30) & 0x800000) != 0) {
    plVar3 = (long *)0x0;
  }
  iVar1 = 0;
  pE2 = (Expr *)in_RSI[4];
  while( true ) {
    if (*(int *)((long)in_RSI + 0x14) <= iVar1) {
      return 0;
    }
    if ((((*(uint *)(*(long *)pE2 + 4) & 1) == 0) || (*(short *)(*(long *)pE2 + 0x34) == in_EDI)) &&
       (iVar2 = sqlite3ExprImpliesExpr
                          ((Parse *)in_RDX,(Expr *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),pE2,
                           (int)((ulong)plVar3 >> 0x20)), iVar2 != 0)) break;
    iVar1 = iVar1 + 1;
    pE2 = (Expr *)&pE2->y;
  }
  return 1;
}

Assistant:

static int whereUsablePartialIndex(int iTab, WhereClause *pWC, Expr *pWhere){
  int i;
  WhereTerm *pTerm;
  Parse *pParse = pWC->pWInfo->pParse;
  while( pWhere->op==TK_AND ){
    if( !whereUsablePartialIndex(iTab,pWC,pWhere->pLeft) ) return 0;
    pWhere = pWhere->pRight;
  }
  if( pParse->db->flags & SQLITE_EnableQPSG ) pParse = 0;
  for(i=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    Expr *pExpr = pTerm->pExpr;
    if( (!ExprHasProperty(pExpr, EP_FromJoin) || pExpr->iRightJoinTable==iTab)
     && sqlite3ExprImpliesExpr(pParse, pExpr, pWhere, iTab) 
    ){
      return 1;
    }
  }
  return 0;
}